

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Array * json::Json::createArray(Array *__return_storage_ptr__,Node *A)

{
  const_reference VS;
  
  (__return_storage_ptr__->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00132cd8;
  (__return_storage_ptr__->fields).
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fields).
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fields).
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VS = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&(A->production).nodes,1);
  nextValue(__return_storage_ptr__,VS);
  return __return_storage_ptr__;
}

Assistant:

static Array createArray(parser::Node const& A) {
            Array array;
            parser::Node const& VS = A.getProduction().nodes.at(1);
            nextValue(array, VS);
            return array;
        }